

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

void __thiscall
qpdf::pl::Count::Count
          (Count *this,unsigned_long id,string *str,
          unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link)

{
  Link *pLVar1;
  _Head_base<0UL,_Pipeline_*,_false> next;
  
  pLVar1 = (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
           _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  if (pLVar1 == (Link *)0x0) {
    next._M_head_impl = (Pipeline *)0x0;
  }
  else {
    next._M_head_impl =
         *(Pipeline **)
          &(pLVar1->next_pl)._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>;
  }
  Pipeline::Pipeline(&this->super_Pipeline,"",next._M_head_impl);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002b2288;
  this->count = 0;
  this->str = str;
  (this->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t
  .super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t
       .super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
       super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
  this->id_ = id;
  this->pass_immediately_to_next = false;
  return;
}

Assistant:

Count(unsigned long id, std::string& str, std::unique_ptr<Link> link = nullptr) :
            Pipeline("", link ? link->next_pl.get() : nullptr),
            str(&str),
            link(std::move(link)),
            id_(id)
        {
        }